

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O3

bool __thiscall Diligent::QueryVkImpl::AllocateQueries(QueryVkImpl *this)

{
  QueryManagerVk *pQVar1;
  bool bVar2;
  byte bVar3;
  Uint32 UVar4;
  DeviceContextVkImpl *pDVar5;
  char (*in_RCX) [45];
  char (*in_R8) [54];
  long lVar6;
  string msg;
  string local_58;
  char *local_38;
  
  DiscardQueries(this);
  if (this->m_pQueryMgr != (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pQueryMgr == nullptr",(char (*) [23])in_RCX);
    in_RCX = (char (*) [45])0x54;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x54);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  pDVar5 = (this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext.m_pObject;
  if (pDVar5 == (DeviceContextVkImpl *)0x0) {
    FormatString<char[26],char[22]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pContext != nullptr",(char (*) [22])in_RCX);
    in_RCX = (char (*) [45])0x55;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x55);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pDVar5 = (this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext.m_pObject;
  }
  pQVar1 = pDVar5->m_pQueryMgr;
  this->m_pQueryMgr = pQVar1;
  if (pQVar1 == (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pQueryMgr != nullptr",(char (*) [23])in_RCX);
    in_RCX = (char (*) [45])0x57;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x57);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  lVar6 = 0;
  bVar3 = 0;
  while( true ) {
    if (*(int *)(&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 + lVar6 * 4) !=
        -1) {
      FormatString<char[26],char[45]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueryPoolIdx == QueryManagerVk::InvalidIndex",in_RCX);
      in_RCX = (char (*) [45])0x5b;
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"AllocateQueries",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                 ,0x5b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    UVar4 = QueryManagerVk::AllocateQuery
                      (this->m_pQueryMgr,
                       (this->super_QueryBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                       .m_Desc.Type);
    *(Uint32 *)(&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 + lVar6 * 4) =
         UVar4;
    if (UVar4 == 0xffffffff) break;
    lVar6 = 1;
    bVar2 = (bool)((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                   .m_Desc.Type != QUERY_TYPE_DURATION | bVar3);
    bVar3 = 1;
    if (bVar2) {
LAB_002c6697:
      return UVar4 != 0xffffffff;
    }
  }
  local_38 = GetQueryTypeString((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                                .m_Desc.Type);
  FormatString<char[42],char_const*,char[54]>
            (&local_58,(Diligent *)"Failed to allocate Vulkan query for type ",
             (char (*) [42])&local_38,
             (char **)". Increase the query pool size in EngineVkCreateInfo.",in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,local_58._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  DiscardQueries(this);
  goto LAB_002c6697;
}

Assistant:

bool QueryVkImpl::AllocateQueries()
{
    DiscardQueries();

    VERIFY_EXPR(m_pQueryMgr == nullptr);
    VERIFY_EXPR(m_pContext != nullptr);
    m_pQueryMgr = m_pContext->GetQueryManager();
    VERIFY_EXPR(m_pQueryMgr != nullptr);
    for (Uint32 i = 0; i < (m_Desc.Type == QUERY_TYPE_DURATION ? Uint32{2} : Uint32{1}); ++i)
    {
        auto& QueryPoolIdx = m_QueryPoolIndex[i];
        VERIFY_EXPR(QueryPoolIdx == QueryManagerVk::InvalidIndex);

        QueryPoolIdx = m_pQueryMgr->AllocateQuery(m_Desc.Type);
        if (QueryPoolIdx == QueryManagerVk::InvalidIndex)
        {
            LOG_ERROR_MESSAGE("Failed to allocate Vulkan query for type ", GetQueryTypeString(m_Desc.Type),
                              ". Increase the query pool size in EngineVkCreateInfo.");
            DiscardQueries();
            return false;
        }
    }

    return true;
}